

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

void bill_box_content(obj *obj,boolean dummy)

{
  obj *obj_00;
  
  for (obj_00 = obj->cobj; obj_00 != (obj *)0x0; obj_00 = obj_00->nobj) {
    if (obj_00->oclass != '\f') {
      if ((obj_00->field_0x4a & 8) == 0) {
        add_one_tobill(obj_00,dummy);
      }
      if (obj_00->cobj != (obj *)0x0) {
        bill_box_content(obj_00,dummy);
      }
    }
  }
  return;
}

Assistant:

void bill_box_content(struct obj *obj, boolean dummy)
{
	struct obj *otmp;

	for (otmp = obj->cobj; otmp; otmp = otmp->nobj) {
		if (otmp->oclass == COIN_CLASS) continue;

		/* the "top" box is added in addtobill() */
		if (!otmp->no_charge)
		    add_one_tobill(otmp, dummy);
		if (Has_contents(otmp))
		    bill_box_content(otmp, dummy);
	}

}